

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_draw.cxx
# Opt level: O0

void fl_draw(char *str,int x,int y,int w,int h,Fl_Align align,Fl_Image *img,int draw_symbols)

{
  int iVar1;
  Fl_Align align_local;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  char *str_local;
  
  if ((((str != (char *)0x0) && (*str != '\0')) || (img != (Fl_Image *)0x0)) &&
     (((w == 0 || (h == 0)) ||
      ((iVar1 = fl_not_clipped(x,y,w,h), iVar1 != 0 || ((align & 0x10) == 0)))))) {
    if ((align & 0x40) != 0) {
      fl_push_clip(x,y,w,h);
    }
    fl_draw(str,x,y,w,h,align,fl_draw,img,draw_symbols);
    if ((align & 0x40) != 0) {
      fl_pop_clip();
    }
  }
  return;
}

Assistant:

void fl_draw(
  const char* str,
  int x, int y, int w, int h,
  Fl_Align align,
  Fl_Image* img,
  int draw_symbols)
{
  if ((!str || !*str) && !img) return;
  if (w && h && !fl_not_clipped(x, y, w, h) && (align & FL_ALIGN_INSIDE)) return;
  if (align & FL_ALIGN_CLIP)
    fl_push_clip(x, y, w, h);
  fl_draw(str, x, y, w, h, align, fl_draw, img, draw_symbols);
  if (align & FL_ALIGN_CLIP)
    fl_pop_clip();
}